

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_sin(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  undefined8 *puVar5;
  long *plVar6;
  char *in_RCX;
  char *in_RDX;
  char *in_RDI;
  char *tmp;
  err_frame_t err_cur__;
  char *pi;
  int neg_result;
  char *ext7;
  char *ext6;
  char *ext5;
  char *ext4;
  char *ext3;
  char *ext2;
  char *ext1;
  uint hdl7;
  uint hdl6;
  uint hdl5;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  size_t prec;
  char *new_ext;
  char *pcVar7;
  undefined4 uVar8;
  uint *puVar9;
  char *src;
  uint *dst;
  char **in_stack_fffffffffffffdf8;
  char *ext4_00;
  uint *in_stack_fffffffffffffe00;
  unsigned_long *remp;
  vm_val_t *in_stack_fffffffffffffe08;
  char *ext2_00;
  undefined8 in_stack_fffffffffffffe10;
  vm_obj_id_t self_00;
  char *ext2_01;
  CVmObjBigNum *in_stack_fffffffffffffe18;
  void *pvVar10;
  CVmObjBigNum *in_stack_fffffffffffffe20;
  undefined8 uVar11;
  char *ext5_00;
  char *ext6_00;
  char *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe54;
  void *local_1a0;
  uint local_c4;
  size_t in_stack_ffffffffffffff40;
  char local_b8 [4];
  int iStack_b4;
  undefined8 local_b0;
  undefined4 uStack_ac;
  char local_a8 [8];
  char local_a0 [8];
  char *local_98;
  char *local_90;
  undefined4 local_84;
  undefined4 local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  char *in_stack_ffffffffffffffa0;
  
  self_00 = (vm_obj_id_t)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  pcVar4 = (char *)get_prec((char *)0x2b25f6);
  iVar1 = setup_getp_0(in_stack_fffffffffffffe18,self_00,in_stack_fffffffffffffe08,
                       in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  if (iVar1 == 0) {
    cache_pi(in_stack_ffffffffffffff40);
    pcVar7 = local_a0;
    puVar9 = &local_74;
    src = local_a8;
    dst = &local_78;
    ext4_00 = local_b8;
    remp = (unsigned_long *)&local_80;
    ext2_00 = &stack0xffffffffffffff40;
    ext2_01 = (char *)&local_84;
    ext5_00 = pcVar7;
    ext6_00 = ext2_01;
    alloc_temp_regs((size_t)(pcVar4 + 3),7,&local_90,&local_6c,&local_98,&local_70,pcVar7);
    uVar8 = (undefined4)((ulong)pcVar7 >> 0x20);
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    uVar11 = *puVar5;
    plVar6 = (long *)_ZTW11G_err_frame();
    *plVar6 = (long)&stack0xfffffffffffffe50;
    uVar2 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffe68);
    iVar1 = (int)((ulong)puVar9 >> 0x20);
    if (uVar2 == 0) {
      copy_val((char *)dst,src,iVar1);
      local_c4 = get_neg(local_90);
      set_neg(local_90,0);
      copy_val((char *)dst,src,(int)((ulong)puVar9 >> 0x20));
      mul_by_long((char *)remp,(unsigned_long)ext4_00);
      while( true ) {
        iVar1 = compare_abs((char *)in_stack_fffffffffffffe18,ext2_01);
        iVar3 = (int)((ulong)puVar9 >> 0x20);
        if (iVar1 < 1) break;
        compute_quotient_into(in_RDX,in_RCX,in_stack_ffffffffffffffa0,pcVar4);
        pcVar7 = local_98;
        local_98 = local_90;
        in_stack_fffffffffffffe48 = local_90;
        local_90 = pcVar7;
      }
      copy_val((char *)dst,src,iVar3);
      iVar1 = compare_abs((char *)in_stack_fffffffffffffe18,ext2_01);
      if (0 < iVar1) {
        local_c4 = (uint)((local_c4 != 0 ^ 0xffU) & 1);
        compute_abs_diff_into
                  ((char *)CONCAT44(in_stack_fffffffffffffe54,uVar2),in_stack_fffffffffffffe48,
                   in_RDI);
        in_stack_fffffffffffffe48 = local_90;
        local_90 = local_98;
        local_98 = in_stack_fffffffffffffe48;
      }
      div_by_long(ext2_01,(unsigned_long)ext2_00,remp);
      iVar1 = compare_abs((char *)in_stack_fffffffffffffe18,ext2_01);
      if (0 < iVar1) {
        local_c4 = (uint)((local_c4 != 0 ^ 0xffU) & 1);
        copy_val((char *)dst,src,iVar3);
        compute_abs_diff_into
                  ((char *)CONCAT44(in_stack_fffffffffffffe54,uVar2),in_stack_fffffffffffffe48,
                   in_RDI);
        in_stack_fffffffffffffe48 = local_90;
        local_90 = local_98;
        local_98 = in_stack_fffffffffffffe48;
      }
      iVar1 = get_neg(local_90);
      if (iVar1 != 0) {
        local_c4 = (uint)((local_c4 != 0 ^ 0xffU) & 1);
      }
      set_neg(local_90,0);
      copy_val((char *)dst,src,iVar3);
      div_by_long(ext2_01,(unsigned_long)ext2_00,remp);
      iVar1 = compare_abs((char *)in_stack_fffffffffffffe18,ext2_01);
      if (iVar1 < 1) {
        uVar8 = uStack_ac;
        iVar1 = iStack_b4;
        calc_sin_series(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,ext2_01,ext2_00,
                        (char *)remp,ext4_00,ext5_00,ext6_00,in_RDI);
      }
      else {
        copy_val((char *)dst,src,iVar3);
        div_by_long(ext2_01,(unsigned_long)ext2_00,remp);
        compute_abs_diff_into
                  ((char *)CONCAT44(in_stack_fffffffffffffe54,uVar2),in_stack_fffffffffffffe48,
                   in_RDI);
        set_neg(local_90,0);
        pcVar4 = local_90;
        local_90 = local_98;
        local_98 = pcVar4;
        uVar8 = uStack_ac;
        iVar1 = iStack_b4;
        calc_cos_series(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,ext2_01,ext2_00,
                        (char *)remp,ext4_00,ext5_00,ext6_00,in_RDI);
      }
      if (local_c4 != 0) {
        iVar3 = get_neg(in_stack_ffffffffffffffa0);
        set_neg(in_stack_ffffffffffffffa0,(uint)((iVar3 != 0 ^ 0xffU) & 1));
      }
      normalize((char *)dst);
    }
    if ((uVar2 & 0x8000) == 0) {
      release_temp_regs(7,(ulong)local_6c,(ulong)local_70,(ulong)local_74,(ulong)local_78,
                        (ulong)local_7c,CONCAT44(uVar8,local_80),CONCAT44(iVar1,local_84));
    }
    puVar5 = (undefined8 *)_ZTW11G_err_frame();
    *puVar5 = uVar11;
    if ((uVar2 & 0x4001) != 0) {
      puVar5 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar5 & 2) != 0) {
        plVar6 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar6 + 0x10));
      }
      pvVar10 = local_1a0;
      plVar6 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar6 + 0x10) = pvVar10;
      err_rethrow();
    }
    if ((uVar2 & 2) != 0) {
      free(local_1a0);
    }
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_sin(VMG_ vm_obj_id_t self,
                           vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    uint hdl1, hdl2, hdl3, hdl4, hdl5, hdl6, hdl7;
    char *ext1, *ext2, *ext3, *ext4, *ext5, *ext6, *ext7;
    int neg_result;
    const char *pi;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* cache pi */
    pi = cache_pi(prec + 3);

    /* 
     *   Allocate our temporary registers.  We'll use 1 and 2 to calculate
     *   x^n - we'll start with x^(n-2) in one, and multiply by x^2 to put
     *   the result in the other.  3 we'll use to store n!.  4 we'll use
     *   to store the result of x^n/n!, and 5 and 6 we'll swap as the
     *   master accumulator.  7 we'll use to store x^2.
     *   
     *   Allocate the temporary registers with more digits of precision
     *   than we need in the result, to ensure that accumulated rounding
     *   errors don't affect the result.  
     */
    alloc_temp_regs(prec + 3, 7,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4, &ext5, &hdl5, &ext6, &hdl6, &ext7, &hdl7);

    /* protect against errors so we definitely free the registers */
    err_try
    {
        char *tmp;

        /* copy our initial value to ext1 */
        copy_val(ext1, ext_, FALSE);

        /*
         *   Note that sin(-x) = -sin(x).  If x < 0, note the negative
         *   sign and then negate the value so that we calculate sin(x)
         *   and return the negative of the result.  
         */
        neg_result = get_neg(ext1);
        set_neg(ext1, FALSE);

        /* calculate 2*pi */
        copy_val(ext7, pi, TRUE);
        mul_by_long(ext7, 2);

        /*
         *   Because we'll use a Taylor series around 0 to calculate the
         *   result, we want our value as close to the expansion point (0)
         *   as possible to speed up convergence of the series.
         *   Fortunately this is especially easy for sin() because of the
         *   periodic nature of the function.
         *   
         *   First, note that sin(2*pi*i + x) = sin(x) for all integers i,
         *   so we can reduce the argument mod 2*pi until it's in the
         *   range 0 <= x < 2*pi (we might have to do this multiple times
         *   if the number's scale exceeds its precision).  Note that we
         *   already made sure the number is positive.  
         */
        while (compare_abs(ext1, ext7) > 0)
        {
            /* divide by 2*pi, storing the remainder in r2 */
            compute_quotient_into(ext6, ext2, ext1, ext7);

            /* swap r2 into r1 for the next round */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /*
         *   Next, note that sin(x+pi) = -sin(x).  If x > pi, negate the
         *   result (again if necessary) and reduce the argument by pi.
         *   This will reduce our range to 0 <= x <= pi.  
         */
        copy_val(ext7, pi, TRUE);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* negate the result */
            neg_result = !neg_result;

            /* subtract pi from the argument */
            compute_abs_diff_into(ext2, ext1, ext7);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /*
         *   Use the fact that sin(x + pi) = -sin(x) once again: if x >
         *   pi/2, subtract pi from x to adjust the range to -pi/2 <= x <=
         *   pi/2.  
         */
        div_by_long(ext7, 2);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* negate the result */
            neg_result = !neg_result;
            
            /* subtract pi from the argument */
            copy_val(ext7, pi, TRUE);
            compute_abs_diff_into(ext2, ext1, ext7);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /* 
         *   once again, reduce our range using the sign equivalence -
         *   this will limit our range to 0 <= x <= pi/2 
         */
        if (get_neg(ext1))
            neg_result = !neg_result;
        set_neg(ext1, FALSE);

        /*
         *   Next, observe that sin(x+pi/2) = cos(x).  If x > pi/4,
         *   calculate using the cosine series instead of the sine series.
         */
        copy_val(ext7, pi, TRUE);
        div_by_long(ext7, 4);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* calculate pi/2 */
            copy_val(ext7, pi, TRUE);
            div_by_long(ext7, 2);
            
            /* 
             *   subtract pi/2 - this will give us a value in the range
             *   -pi/4 <= x <= pi/4 
             */
            compute_abs_diff_into(ext2, ext1, ext7);

            /* cos(-x) = cos(x), so we can ignore the sign */
            set_neg(ext1, FALSE);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;

            /* calculate the cosine series */
            calc_cos_series(vmg_ new_ext,
                            ext1, ext2, ext3, ext4, ext5, ext6, ext7);
        }
        else
        {
            /*
             *   We now have a value in the range 0 <= x <= pi/4, which
             *   will converge quickly with our Taylor series 
             */
            calc_sin_series(vmg_ new_ext,
                            ext1, ext2, ext3, ext4, ext5, ext6, ext7);
        }

        /* negate the result if necessary */
        if (neg_result)
            set_neg(new_ext, !get_neg(new_ext));

        /* normalize the result */
        normalize(new_ext);
    }